

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::AffineTransform::forward_dev_impl<dynet::Device_CPU>
          (AffineTransform *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  float *__src;
  uint uVar1;
  size_type sVar2;
  const_reference ppTVar3;
  ulong uVar4;
  void *pvVar5;
  Dim *in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  bool bVar6;
  uint b;
  uint i;
  float *in_ptr;
  float *end_ptr;
  float *curr_ptr;
  size_t batch_size;
  uint in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  Tensor *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe38;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffe40;
  Tensor *in_stack_fffffffffffffe48;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  in_stack_fffffffffffffe50;
  Tensor *in_stack_fffffffffffffe58;
  uint local_124;
  uint local_74;
  void *local_60;
  
  sVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::size(in_RDX);
  if ((sVar2 & 1) != 1) {
    __assert_fail("xs.size() % 2 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0xe6,
                  "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  sVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::size(in_RDX);
  if (sVar2 == 1) {
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    *(float **)(in_RCX[1].d + 1) = (*ppTVar3)->v;
  }
  else {
    uVar1 = in_RCX->bd;
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    if (uVar1 == ((*ppTVar3)->d).bd) {
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,0);
      Tensor::tvec(in_stack_fffffffffffffe20);
      Tensor::tvec(in_stack_fffffffffffffe20);
      Eigen::
      TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
      device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)in_stack_fffffffffffffe20,
                 (DefaultDevice *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator=(in_stack_fffffffffffffe30,
                  (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
                  CONCAT44(uVar1,in_stack_fffffffffffffe28));
    }
    else {
      ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      bVar6 = false;
      if (((*ppTVar3)->d).bd == 1) {
        bVar6 = in_RCX->bd != 1;
      }
      if (!bVar6) {
        __assert_fail("xs[0]->d.bd == 1 && fx.d.bd != 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                      ,0xef,
                      "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                     );
      }
      uVar1 = Dim::batch_size(in_RCX);
      uVar4 = (ulong)uVar1;
      local_60 = *(void **)(in_RCX[1].d + 1);
      pvVar5 = (void *)((long)local_60 + uVar4 * in_RCX->bd * 4);
      ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,0);
      __src = (*ppTVar3)->v;
      do {
        memcpy(local_60,__src,uVar4 << 2);
        local_60 = (void *)(uVar4 * 4 + (long)local_60);
      } while (local_60 != pvVar5);
    }
    local_74 = 1;
    while( true ) {
      uVar4 = (ulong)local_74;
      sVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::size
                        (in_RDX);
      if (sVar2 <= uVar4) break;
      ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                operator[](in_RDX,(ulong)local_74);
      if ((((*ppTVar3)->d).bd == 1) &&
         (ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                    operator[](in_RDX,(ulong)(local_74 + 1)), ((*ppTVar3)->d).bd == in_RCX->bd)) {
        std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                  (in_RDX,(ulong)local_74);
        Tensor::operator*(in_stack_fffffffffffffe48);
        std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                  (in_RDX,(ulong)(local_74 + 1));
        Tensor::colbatch_matrix(in_stack_fffffffffffffe58);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator*(in_stack_fffffffffffffe38,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_fffffffffffffe30);
        Tensor::colbatch_matrix(in_stack_fffffffffffffe58);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        noalias((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=(in_stack_fffffffffffffe40,
                     (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)in_stack_fffffffffffffe38);
      }
      else {
        ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                  operator[](in_RDX,(ulong)(local_74 + 1));
        in_stack_fffffffffffffe1c = CONCAT13(1,(int3)in_stack_fffffffffffffe1c);
        if (((*ppTVar3)->d).bd != 1) {
          ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                    operator[](in_RDX,(ulong)(local_74 + 1));
          in_stack_fffffffffffffe18 = ((*ppTVar3)->d).bd;
          ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                    operator[](in_RDX,(ulong)local_74);
          in_stack_fffffffffffffe1c =
               CONCAT13(in_stack_fffffffffffffe18 == ((*ppTVar3)->d).bd,
                        (int3)in_stack_fffffffffffffe1c);
        }
        if ((char)((uint)in_stack_fffffffffffffe1c >> 0x18) == '\0') {
          __assert_fail("xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd",
                        "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                        ,0x108,
                        "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                       );
        }
        for (local_124 = 0; uVar1 = (uint)((ulong)in_stack_fffffffffffffe50.m_expression >> 0x20),
            local_124 < in_RCX->bd; local_124 = local_124 + 1) {
          std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                    (in_RDX,(ulong)local_74);
          Tensor::batch_matrix(in_stack_fffffffffffffe58,uVar1);
          std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                    (in_RDX,(ulong)(local_74 + 1));
          Tensor::batch_matrix(in_stack_fffffffffffffe58,uVar1);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
          operator*(in_stack_fffffffffffffe38,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffe30);
          Tensor::batch_matrix(in_stack_fffffffffffffe58,uVar1);
          in_stack_fffffffffffffe50 =
               Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
               ::noalias((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          Eigen::
          NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
          ::operator+=(in_stack_fffffffffffffe40,
                       (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)in_stack_fffffffffffffe38);
        }
      }
      local_74 = local_74 + 2;
    }
  }
  return;
}

Assistant:

void AffineTransform::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() % 2 == 1);
  if (xs.size() == 1) {
    fx.v = xs[0]->v;
    return;
  } else {
    // Add the first matrix
    if(fx.d.bd == xs[0]->d.bd) {
      fx.tvec().device(*dev.edevice) = xs[0]->tvec();
    } else {
      assert(xs[0]->d.bd == 1 && fx.d.bd != 1);
#ifdef __CUDACC__
      Eigen::array<int, 3> bcast; bcast[0] = bcast[1] = 1; bcast[2] = fx.d.bd;
      fx.tb<2>().device(*dev.edevice) = xs[0]->tb<2>().broadcast(bcast);
#else
      size_t batch_size = fx.d.batch_size();
      float *curr_ptr = fx.v, *end_ptr = curr_ptr + batch_size * fx.d.bd, *in_ptr = xs[0]->v;
      do {
        memcpy(curr_ptr, in_ptr, sizeof(float)*batch_size);
        curr_ptr += batch_size;
      } while(curr_ptr != end_ptr);
#endif
    }

    // Perform multiplication
#ifdef __CUDACC__
    for (unsigned i = 1; i < xs.size(); i += 2)
      // fx = (acc_sclar)*fx + xs[0] * xs[1]
      CUDAMatrixMultiply(dev, *xs[i], *xs[i + 1], fx, kSCALAR_ONE);
#else
    // Multiply
    for (unsigned i = 1; i < xs.size(); i += 2) {
      if(xs[i]->d.bd == 1 && xs[i+1]->d.bd == fx.d.bd) {
        fx.colbatch_matrix().noalias() += **xs[i] * xs[i+1]->colbatch_matrix();
      } else {
        assert(xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd);
        for(unsigned b = 0; b < fx.d.bd; ++b) {
          fx.batch_matrix(b).noalias() += xs[i]->batch_matrix(b) * xs[i+1]->batch_matrix(b);
        }
      }
    }
#endif
  }
}